

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat2.c
# Opt level: O2

void mul_mat_f32_naive(float *src0,float *src1,float *dst,int m,int n,int k)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int l;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  float sum;
  undefined1 auVar8 [16];
  
  uVar1 = 0;
  uVar3 = 0;
  if (0 < k) {
    uVar3 = (ulong)(uint)k;
  }
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  uVar2 = (ulong)(uint)m;
  if (m < 1) {
    uVar2 = uVar1;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    pfVar6 = src1;
    for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
      auVar8 = ZEXT816(0) << 0x40;
      for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
        auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)src0[uVar5]),ZEXT416((uint)pfVar6[uVar5]));
      }
      dst[uVar1 * (long)n + uVar7] = auVar8._0_4_;
      pfVar6 = pfVar6 + k;
    }
    src0 = src0 + k;
  }
  return;
}

Assistant:

void mul_mat_f32_naive(
    const float * restrict src0, // M x K
    const float * restrict src1, // N x K (transposed)
    float * dst,
    int m, int n, int k) {
    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            float sum = 0;
            for (int l = 0; l < k; l++) {
                sum += src0[i*k + l] * src1[j*k + l];
            }
            dst[i*n + j] = sum;
        }
    }
}